

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

JSON __thiscall JSON::makeBool(JSON *this,bool value)

{
  _Head_base<0UL,_JSON::JSON_value_*,_false> _Var1;
  Members *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar2;
  
  _Var1._M_head_impl = (JSON_value *)operator_new(0x10);
  (_Var1._M_head_impl)->type_code = vt_bool;
  (_Var1._M_head_impl)->_vptr_JSON_value = (_func_int **)&PTR__JSON_value_002eaf40;
  (_Var1._M_head_impl)->field_0xc = value;
  __p = (Members *)operator_new(0x18);
  (__p->value)._M_t.super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>.
  _M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
  super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl = _Var1._M_head_impl;
  __p->start = 0;
  __p->end = 0;
  (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<JSON::Members*>
            (&(this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             __p);
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeBool(bool value)
{
    return {std::make_unique<JSON_bool>(value)};
}